

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SPIRAccessChain * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::
allocate<unsigned_int_const&,spv::StorageClass_const&,std::__cxx11::string&,std::__cxx11::string&,unsigned_int&>
          (ObjectPool<spirv_cross::SPIRAccessChain> *this,uint *p,StorageClass *p_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p_3,uint *p_4)

{
  TypeID basetype_;
  StorageClass storage_;
  size_t sVar1;
  pointer pcVar2;
  _Tuple_impl<0UL,_spirv_cross::SPIRAccessChain_*,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>
  _Var3;
  ulong uVar4;
  SPIRAccessChain *this_00;
  uint uVar5;
  _Head_base<0UL,_spirv_cross::SPIRAccessChain_*,_false> _Var6;
  string local_70;
  string local_50;
  
  if ((this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>.buffer_size == 0) {
    uVar5 = this->start_object_count <<
            ((byte)(this->memory).
                   super_VectorView<std::unique_ptr<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>_>
                   .buffer_size & 0x1f);
    uVar4 = (ulong)uVar5;
    _Var3.super__Head_base<0UL,_spirv_cross::SPIRAccessChain_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRAccessChain_*,_false>)malloc(uVar4 * 0xa8);
    if (_Var3.super__Head_base<0UL,_spirv_cross::SPIRAccessChain_*,_false>._M_head_impl !=
        (SPIRAccessChain *)0x0) {
      _Var6._M_head_impl =
           (SPIRAccessChain *)
           _Var3.super__Head_base<0UL,_spirv_cross::SPIRAccessChain_*,_false>._M_head_impl;
      if (uVar5 != 0) {
        do {
          SmallVector<spirv_cross::SPIRAccessChain_*,_0UL>::reserve
                    (&this->vacants,
                     (this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>.buffer_size +
                     1);
          sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>.buffer_size;
          (this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>.ptr[sVar1] =
               _Var6._M_head_impl;
          (this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>.buffer_size = sVar1 + 1;
          uVar4 = uVar4 - 1;
          _Var6._M_head_impl = _Var6._M_head_impl + 1;
        } while (uVar4 != 0);
      }
      SmallVector<std::unique_ptr<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>,_8UL>
      ::reserve(&this->memory,
                (this->memory).
                super_VectorView<std::unique_ptr<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>_>
                .buffer_size + 1);
      sVar1 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>_>
              .buffer_size;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>_>
      .ptr[sVar1]._M_t.
      super___uniq_ptr_impl<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_spirv_cross::SPIRAccessChain_*,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>
      .super__Head_base<0UL,_spirv_cross::SPIRAccessChain_*,_false> =
           _Var3.super__Head_base<0UL,_spirv_cross::SPIRAccessChain_*,_false>._M_head_impl;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>_>
      .buffer_size = sVar1 + 1;
      if (_Var3.super__Head_base<0UL,_spirv_cross::SPIRAccessChain_*,_false>._M_head_impl !=
          (SPIRAccessChain *)0x0) goto LAB_00238b31;
    }
    this_00 = (SPIRAccessChain *)0x0;
  }
  else {
LAB_00238b31:
    sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>.buffer_size;
    this_00 = (this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>.ptr[sVar1 - 1];
    if (sVar1 != 0) {
      SmallVector<spirv_cross::SPIRAccessChain_*,_0UL>::resize(&this->vacants,sVar1 - 1);
    }
    basetype_.id = *p;
    storage_ = *p_1;
    pcVar2 = (p_2->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + p_2->_M_string_length);
    pcVar2 = (p_3->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + p_3->_M_string_length);
    SPIRAccessChain::SPIRAccessChain(this_00,basetype_,storage_,&local_50,&local_70,*p_4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return this_00;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}